

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_max_eigenvalues(Omega_h *this,Int dim,Reals *symms)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Reals RVar2;
  Read<double> local_50 [2];
  Read<double> local_30;
  Reals *local_20;
  Reals *symms_local;
  Omega_h *pOStack_10;
  Int dim_local;
  
  local_20 = symms;
  symms_local._4_4_ = dim;
  pOStack_10 = this;
  if (dim == 3) {
    Read<double>::Read(&local_30,symms);
    get_max_eigenvalues_dim<3>(this,&local_30);
    Read<double>::~Read(&local_30);
    pvVar1 = extraout_RDX;
  }
  else if (dim == 2) {
    Read<double>::Read(local_50,symms);
    get_max_eigenvalues_dim<2>(this,local_50);
    Read<double>::~Read(local_50);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (dim != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.cpp"
           ,0x27);
    }
    Read<double>::Read((Read<double> *)this,(Read<signed_char> *)symms);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_max_eigenvalues(Int dim, Reals symms) {
  if (dim == 3) return get_max_eigenvalues_dim<3>(symms);
  if (dim == 2) return get_max_eigenvalues_dim<2>(symms);
  if (dim == 1) return symms;
  OMEGA_H_NORETURN(Reals());
}